

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O2

void __thiscall QFramePrivate::updateStyledFrameWidths(QFramePrivate *this)

{
  long lVar1;
  QWidget *this_00;
  short sVar2;
  QStyle *pQVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QStyleOptionFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame(&opt);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,&opt);
  pQVar3 = QWidget::style(this_00);
  auVar7 = (**(code **)(*(long *)pQVar3 + 0xc0))(pQVar3,0x33,&opt,this_00);
  sVar5 = auVar7._0_2_ - (short)opt.super_QStyleOption.rect.x1.m_i;
  this->leftFrameWidth = sVar5;
  sVar2 = auVar7._4_2_ - (short)opt.super_QStyleOption.rect.y1.m_i;
  this->topFrameWidth = sVar2;
  sVar4 = (short)opt.super_QStyleOption.rect.x2.m_i - auVar7._8_2_;
  this->rightFrameWidth = sVar4;
  sVar6 = (short)opt.super_QStyleOption.rect.y2.m_i - auVar7._12_2_;
  if (sVar4 < sVar5) {
    sVar4 = sVar5;
  }
  this->bottomFrameWidth = sVar6;
  if (sVar6 < sVar2) {
    sVar6 = sVar2;
  }
  if (sVar6 < sVar4) {
    sVar6 = sVar4;
  }
  this->frameWidth = sVar6;
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFramePrivate::updateStyledFrameWidths()
{
    Q_Q(const QFrame);
    QStyleOptionFrame opt;
    q->initStyleOption(&opt);

    QRect cr = q->style()->subElementRect(QStyle::SE_ShapedFrameContents, &opt, q);
    leftFrameWidth = cr.left() - opt.rect.left();
    topFrameWidth = cr.top() - opt.rect.top();
    rightFrameWidth = opt.rect.right() - cr.right(),
    bottomFrameWidth = opt.rect.bottom() - cr.bottom();
    frameWidth = qMax(qMax(leftFrameWidth, rightFrameWidth),
                      qMax(topFrameWidth, bottomFrameWidth));
}